

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O1

MtrNode * Mtr_CopyTree(MtrNode *node,int expansion)

{
  MtrNode *auxnode;
  MtrNode *node_00;
  MtrNode *pMVar1;
  
  if ((0 < expansion && node != (MtrNode *)0x0) &&
     (node_00 = (MtrNode *)malloc(0x30), node_00 != (MtrNode *)0x0)) {
    node_00->elder = (MtrNode *)0x0;
    node_00->younger = (MtrNode *)0x0;
    node_00->parent = (MtrNode *)0x0;
    node_00->child = (MtrNode *)0x0;
    if (node->child != (MtrNode *)0x0) {
      pMVar1 = Mtr_CopyTree(node->child,expansion);
      node_00->child = pMVar1;
      if (pMVar1 == (MtrNode *)0x0) {
        free(node_00);
        return (MtrNode *)0x0;
      }
    }
    if (node->younger != (MtrNode *)0x0) {
      pMVar1 = Mtr_CopyTree(node->younger,expansion);
      node_00->younger = pMVar1;
      if (pMVar1 == (MtrNode *)0x0) {
        Mtr_FreeTree(node_00);
        return (MtrNode *)0x0;
      }
    }
    node_00->flags = node->flags;
    node_00->low = node->low * expansion;
    node_00->size = node->size * expansion;
    node_00->index = expansion * node->index;
    if (node_00->younger != (MtrNode *)0x0) {
      node_00->younger->elder = node_00;
    }
    for (pMVar1 = node_00->child; pMVar1 != (MtrNode *)0x0; pMVar1 = pMVar1->younger) {
      pMVar1->parent = node_00;
    }
    return node_00;
  }
  return (MtrNode *)0x0;
}

Assistant:

MtrNode *
Mtr_CopyTree(
  MtrNode * node,
  int  expansion)
{
    MtrNode *copy;

    if (node == NULL) return(NULL);
    if (expansion < 1) return(NULL);
    copy = Mtr_AllocNode();
    if (copy == NULL) return(NULL);
    copy->parent = copy->elder = copy->child = copy->younger = NULL;
    if (node->child != NULL) {
        copy->child = Mtr_CopyTree(node->child, expansion);
        if (copy->child == NULL) {
            Mtr_DeallocNode(copy);
            return(NULL);
        }
    }
    if (node->younger != NULL) {
        copy->younger = Mtr_CopyTree(node->younger, expansion);
        if (copy->younger == NULL) {
            Mtr_FreeTree(copy);
            return(NULL);
        }
    }
    copy->flags = node->flags;
    copy->low = node->low * expansion;
    copy->size = node->size * expansion;
    copy->index = node->index * expansion;
    if (copy->younger) copy->younger->elder = copy;
    if (copy->child) {
        MtrNode *auxnode = copy->child;
        while (auxnode != NULL) {
            auxnode->parent = copy;
            auxnode = auxnode->younger;
        }
    }
    return(copy);

}